

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O1

int mbedtls_gcm_update(mbedtls_gcm_context *ctx,uchar *input,size_t input_length,uchar *output,
                      size_t output_size,size_t *output_length)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong use_len;
  uchar ectr [16];
  uchar local_48 [16];
  ulong local_38;
  
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  iVar1 = -0x16;
  if (input_length <= output_size) {
    *output_length = input_length;
    iVar1 = 0;
    if (((input_length != 0) &&
        (iVar1 = -0x14, output <= input || input_length <= (ulong)((long)output - (long)input))) &&
       (uVar3 = ctx->len, uVar3 + input_length < 0xfffffffe1 && !CARRY8(uVar3,input_length))) {
      if ((uVar3 == 0) && ((ctx->add_len & 0xf) != 0)) {
        gcm_mult(ctx,ctx->buf,ctx->buf);
      }
      uVar3 = ctx->len & 0xf;
      if (uVar3 != 0) {
        use_len = 0x10 - uVar3;
        if (input_length <= 0x10 - uVar3) {
          use_len = input_length;
        }
        local_38 = uVar3;
        iVar1 = gcm_mask(ctx,local_48,uVar3,use_len,input,output);
        if (iVar1 == 0) {
          if (local_38 + use_len == 0x10) {
            gcm_mult(ctx,ctx->buf,ctx->buf);
          }
          ctx->len = ctx->len + use_len;
          input_length = input_length - use_len;
          input = input + use_len;
          output = output + use_len;
        }
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      ctx->len = ctx->len + input_length;
      if (0xf < input_length) {
        do {
          uVar2 = *(uint *)(ctx->y + 0xc);
          uVar2 = (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
                  + 1;
          *(uint *)(ctx->y + 0xc) =
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 * 0x1000000;
          iVar1 = gcm_mask(ctx,local_48,0,0x10,input,output);
          if (iVar1 != 0) {
            return iVar1;
          }
          gcm_mult(ctx,ctx->buf,ctx->buf);
          input_length = input_length - 0x10;
          input = input + 0x10;
          output = output + 0x10;
        } while (0xf < input_length);
      }
      if (input_length != 0) {
        uVar2 = *(uint *)(ctx->y + 0xc);
        uVar2 = (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) +
                1;
        *(uint *)(ctx->y + 0xc) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 * 0x1000000;
        iVar1 = gcm_mask(ctx,local_48,0,input_length,input,output);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      mbedtls_platform_zeroize(local_48,0x10);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_gcm_update(mbedtls_gcm_context *ctx,
                       const unsigned char *input, size_t input_length,
                       unsigned char *output, size_t output_size,
                       size_t *output_length)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const unsigned char *p = input;
    unsigned char *out_p = output;
    size_t offset;
    unsigned char ectr[16] = { 0 };

    if (output_size < input_length) {
        return MBEDTLS_ERR_GCM_BUFFER_TOO_SMALL;
    }
    *output_length = input_length;

    /* Exit early if input_length==0 so that we don't do any pointer arithmetic
     * on a potentially null pointer.
     * Returning early also means that the last partial block of AD remains
     * untouched for mbedtls_gcm_finish */
    if (input_length == 0) {
        return 0;
    }

    if (output > input && (size_t) (output - input) < input_length) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    /* Total length is restricted to 2^39 - 256 bits, ie 2^36 - 2^5 bytes
     * Also check for possible overflow */
    if (ctx->len + input_length < ctx->len ||
        (uint64_t) ctx->len + input_length > 0xFFFFFFFE0ull) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    if (ctx->len == 0 && ctx->add_len % 16 != 0) {
        gcm_mult(ctx, ctx->buf, ctx->buf);
    }

    offset = ctx->len % 16;
    if (offset != 0) {
        size_t use_len = 16 - offset;
        if (use_len > input_length) {
            use_len = input_length;
        }

        if ((ret = gcm_mask(ctx, ectr, offset, use_len, p, out_p)) != 0) {
            return ret;
        }

        if (offset + use_len == 16) {
            gcm_mult(ctx, ctx->buf, ctx->buf);
        }

        ctx->len += use_len;
        input_length -= use_len;
        p += use_len;
        out_p += use_len;
    }

    ctx->len += input_length;

    while (input_length >= 16) {
        gcm_incr(ctx->y);
        if ((ret = gcm_mask(ctx, ectr, 0, 16, p, out_p)) != 0) {
            return ret;
        }

        gcm_mult(ctx, ctx->buf, ctx->buf);

        input_length -= 16;
        p += 16;
        out_p += 16;
    }

    if (input_length > 0) {
        gcm_incr(ctx->y);
        if ((ret = gcm_mask(ctx, ectr, 0, input_length, p, out_p)) != 0) {
            return ret;
        }
    }

    mbedtls_platform_zeroize(ectr, sizeof(ectr));
    return 0;
}